

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O1

bool __thiscall QSqlError::operator!=(QSqlError *this,QSqlError *other)

{
  QSqlErrorPrivate *pQVar1;
  QSqlErrorPrivate *pQVar2;
  long lVar3;
  long lVar4;
  byte bVar5;
  QStringView QVar6;
  QStringView QVar7;
  
  pQVar1 = (this->d).d.ptr;
  pQVar2 = (other->d).d.ptr;
  bVar5 = true;
  if (pQVar1->errorType == pQVar2->errorType) {
    lVar3 = (pQVar1->errorCode).d.size;
    lVar4 = (pQVar2->errorCode).d.size;
    if (lVar3 == lVar4) {
      QVar6.m_data = (pQVar1->errorCode).d.ptr;
      QVar6.m_size = lVar3;
      QVar7.m_data = (pQVar2->errorCode).d.ptr;
      QVar7.m_size = lVar4;
      bVar5 = QtPrivate::equalStrings(QVar6,QVar7);
      bVar5 = bVar5 ^ 1;
    }
  }
  return (bool)bVar5;
}

Assistant:

constexpr P get() const noexcept { return ptr; }